

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void pnga_median(Integer g_a,Integer g_b,Integer g_c,Integer g_m)

{
  long lVar1;
  Integer mndim;
  Integer cndim;
  Integer bndim;
  Integer andim;
  Integer mtype;
  Integer ctype;
  Integer btype;
  Integer atype;
  Integer mlo [7];
  Integer chi [7];
  Integer clo [7];
  Integer bhi [7];
  Integer blo [7];
  Integer ahi [7];
  Integer alo [7];
  Integer mhi [7];
  
  pnga_inquire(g_a,&atype,&andim,ahi);
  pnga_inquire(g_b,&btype,&bndim,bhi);
  pnga_inquire(g_c,&ctype,&cndim,chi);
  pnga_inquire(g_m,&mtype,&mndim,mhi);
  while (lVar1 = andim + -1, lVar1 != -1) {
    alo[lVar1] = 1;
    andim = lVar1;
  }
  while (lVar1 = bndim + -1, lVar1 != -1) {
    blo[lVar1] = 1;
    bndim = lVar1;
  }
  while (lVar1 = cndim + -1, lVar1 != -1) {
    clo[lVar1] = 1;
    cndim = lVar1;
  }
  while (lVar1 = mndim + -1, lVar1 != -1) {
    mlo[lVar1] = 1;
    mndim = lVar1;
  }
  _ga_sync_begin = 1;
  pnga_median_patch(g_a,alo,ahi,g_b,blo,bhi,g_c,clo,chi,g_m,mlo,mhi);
  return;
}

Assistant:

void pnga_median(Integer g_a, Integer g_b, Integer g_c, Integer g_m){


   Integer atype, andim;
   Integer alo[MAXDIM],ahi[MAXDIM];
   Integer btype, bndim;
   Integer blo[MAXDIM],bhi[MAXDIM];
   Integer ctype, cndim;
   Integer clo[MAXDIM],chi[MAXDIM];
   Integer mtype, mndim;
   Integer mlo[MAXDIM],mhi[MAXDIM];

    pnga_inquire(g_a,  &atype, &andim, ahi);
    pnga_inquire(g_b,  &btype, &bndim, bhi);
    pnga_inquire(g_c,  &ctype, &cndim, chi);
    pnga_inquire(g_m,  &mtype, &mndim, mhi);

    while(andim){
        alo[andim-1]=1;
        andim--;
    }

    while(bndim){
        blo[bndim-1]=1;
        bndim--;
    }

    while(cndim){
        clo[cndim-1]=1;
        cndim--;
    }

    while(mndim){
        mlo[mndim-1]=1;
        mndim--;
    }
    _ga_sync_begin = 1;
    pnga_median_patch(g_a, alo, ahi, g_b, blo, bhi, g_c, clo, chi, g_m, mlo, mhi);

}